

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O0

void anurbs::PolylineMapper<3L>::register_python(module *m)

{
  char *name_00;
  class_<anurbs::PolylineMapper<3l>> *this;
  arg aVar1;
  undefined1 local_b8;
  arg local_b0;
  arg local_a0;
  arg local_90;
  code *local_80;
  undefined8 local_78;
  arg local_70;
  arg local_60;
  constructor<const_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_&>
  local_4d [13];
  handle local_40;
  class_<anurbs::PolylineMapper<3L>_> local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  PolylineMapper<3l>::python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::PolylineMapper<3L>_>::class_<>(&local_38,local_40,name_00);
  pybind11::
  init<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&>
            ();
  local_70 = pybind11::literals::operator____a("points",6);
  local_60.name = local_70.name;
  local_60._8_1_ = local_70._8_1_;
  this = (class_<anurbs::PolylineMapper<3l>> *)
         pybind11::class_<anurbs::PolylineMapper<3l>>::
         def<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&,pybind11::arg>
                   ((class_<anurbs::PolylineMapper<3l>> *)&local_38,local_4d,&local_60);
  local_80 = map;
  local_78 = 0;
  local_a0 = pybind11::literals::operator____a("point",5);
  local_90.name = local_a0.name;
  local_90._8_1_ = local_a0._8_1_;
  aVar1 = pybind11::literals::operator____a("tolerance",9);
  local_b0.name = aVar1.name;
  local_b8 = aVar1._8_1_;
  local_b0._8_1_ = local_b8;
  pybind11::class_<anurbs::PolylineMapper<3l>>::
  def<std::tuple<double,long,double,long>(anurbs::PolylineMapper<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double),pybind11::arg,pybind11::arg>
            (this,"map",(offset_in_Model_to_subr *)&local_80,&local_90,&local_b0);
  pybind11::class_<anurbs::PolylineMapper<3L>_>::~class_(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<const std::vector<Vector>&>(), "points"_a)
            // methods
            .def("map", &Type::map, "point"_a, "tolerance"_a)
        ;
    }